

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

void __thiscall soplex::SPxDevexPR<double>::addedCoVecs(SPxDevexPR<double> *this,int n)

{
  Type TVar1;
  SPxSolverBase<double> *pSVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  
  pSVar2 = (this->super_SPxPricer<double>).thesolver;
  TVar1 = pSVar2->theType;
  pdVar3 = (pSVar2->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (pSVar2->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  VectorBase<double>::reDim(&pSVar2->coWeights,(pSVar2->thecovectors->set).thenum,true);
  pdVar5 = (pSVar2->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = (long)(int)((ulong)((long)(pSVar2->coWeights).val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)pdVar5) >> 3);
      (int)((ulong)((long)pdVar3 - (long)pdVar4) >> 3) < lVar6; lVar6 = lVar6 + -1) {
    pdVar5[lVar6 + -1] = (double)(byte)((TVar1 == ENTER) + 1);
  }
  return;
}

Assistant:

void SPxDevexPR<R>::addedCoVecs(int n)
{
   int initval = (this->thesolver->type() == SPxSolverBase<R>::ENTER) ? 2 : 1;
   VectorBase<R>& coWeights = this->thesolver->coWeights;
   n = coWeights.dim();
   coWeights.reDim(this->thesolver->dim());

   for(int i = coWeights.dim() - 1; i >= n; --i)
      coWeights[i] = initval;
}